

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O1

void __thiscall cmQtAutoGenerator::Logger::Info(Logger *this,GenT genType,string_view message)

{
  int iVar1;
  size_t sVar2;
  char *__s;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string msg;
  string local_b0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_90;
  undefined8 local_78;
  char *local_70;
  undefined8 local_68;
  size_t local_60;
  char *local_58;
  undefined8 local_50;
  size_t local_48;
  char *local_40;
  undefined8 local_38;
  
  sVar2 = message._M_len;
  local_90.first = cmQtAutoGen::GeneratorName(genType);
  if (sVar2 == 0) {
    __s = "\n";
  }
  else {
    __s = "\n";
    if (message._M_str[sVar2 - 1] == '\n') {
      __s = "";
    }
  }
  local_90.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_78 = 2;
  local_70 = ": ";
  local_68 = 0;
  local_50 = 0;
  local_60 = sVar2;
  local_58 = message._M_str;
  local_48 = strlen(__s);
  local_38 = 0;
  views._M_len = 4;
  views._M_array = &local_90;
  local_40 = __s;
  cmCatViews(&local_b0,views);
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  cmSystemTools::Stdout(&local_b0);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmQtAutoGenerator::Logger::Info(GenT genType,
                                     cm::string_view message) const
{
  std::string msg = cmStrCat(GeneratorName(genType), ": ", message,
                             cmHasSuffix(message, '\n') ? "" : "\n");
  {
    std::lock_guard<std::mutex> lock(this->Mutex_);
    cmSystemTools::Stdout(msg);
  }
}